

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestSubdirCommand::InitialPass
          (cmCTestSubdirCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  int iVar8;
  pointer in_name;
  bool bVar9;
  string fname;
  cmWorkingDirectory workdir;
  string cwd;
  string local_f8;
  cmWorkingDirectory local_d8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_d8.OldDir.field_2;
    local_d8.OldDir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_d8.OldDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.OldDir._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.OldDir._M_dataplus._M_p,
                      local_d8.OldDir.field_2._M_allocated_capacity + 1);
    }
    bVar9 = false;
  }
  else {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_50,(SystemTools *)0x1,SUB81(param_2,0));
    in_name = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar9 = in_name == pbVar2;
    if (!bVar9) {
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        bVar3 = cmsys::SystemTools::FileIsFullPath(in_name);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)&local_f8);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_f8);
          std::__cxx11::string::append((char *)&local_f8);
          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(in_name->_M_dataplus)._M_p);
        }
        bVar3 = cmsys::SystemTools::FileIsDirectory(&local_f8);
        iVar8 = 3;
        if (bVar3) {
          cmWorkingDirectory::cmWorkingDirectory(&local_d8,&local_f8);
          if (local_d8.ResultCode == 0) {
            bVar3 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
            if ((!bVar3) && (bVar3 = cmsys::SystemTools::FileExists("DartTestfile.txt"), !bVar3)) {
              iVar8 = 3;
              goto LAB_001a750e;
            }
            std::__cxx11::string::append((char *)&local_f8);
            std::__cxx11::string::append((char *)&local_f8);
            bVar4 = cmMakefile::ReadDependentFile((this->super_cmCommand).Makefile,&local_f8,true);
            bVar3 = false;
            iVar8 = 0;
          }
          else {
            std::operator+(&local_70,"Failed to change directory to ",&local_f8);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_b0 = &local_a0;
            plVar6 = plVar5 + 2;
            if ((long *)*plVar5 == plVar6) {
              local_a0 = *plVar6;
              lStack_98 = plVar5[3];
            }
            else {
              local_a0 = *plVar6;
              local_b0 = (long *)*plVar5;
            }
            local_a8 = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            strerror(local_d8.ResultCode);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_90.field_2._M_allocated_capacity = *psVar7;
              local_90.field_2._8_8_ = plVar5[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar7;
              local_90._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_90._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            cmCommand::SetError(&this->super_cmCommand,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,local_a0 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            iVar8 = 1;
LAB_001a750e:
            bVar3 = true;
            bVar4 = false;
          }
          cmWorkingDirectory::~cmWorkingDirectory(&local_d8);
          if ((!bVar3) && (iVar8 = 0, bVar4 == false)) {
            paVar1 = &local_d8.OldDir.field_2;
            local_d8.OldDir._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"Could not find include file: ","");
            std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
            cmCommand::SetError(&this->super_cmCommand,&local_d8.OldDir);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8.OldDir._M_dataplus._M_p != paVar1) {
              operator_delete(local_d8.OldDir._M_dataplus._M_p,
                              local_d8.OldDir.field_2._M_allocated_capacity + 1);
            }
            iVar8 = 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
        if ((iVar8 != 3) && (iVar8 != 0)) break;
        in_name = in_name + 1;
        bVar9 = in_name == pbVar2;
      } while (!bVar9);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar9;
}

Assistant:

bool cmCTestSubdirCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  for (std::string const& arg : args) {
    std::string fname;

    if (cmSystemTools::FileIsFullPath(arg)) {
      fname = arg;
    } else {
      fname = cwd;
      fname += "/";
      fname += arg;
    }

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // No subdirectory? So what...
      continue;
    }
    bool readit = false;
    {
      cmWorkingDirectory workdir(fname);
      if (workdir.Failed()) {
        this->SetError("Failed to change directory to " + fname + " : " +
                       std::strerror(workdir.GetLastResult()));
        return false;
      }
      const char* testFilename;
      if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
        // does the CTestTestfile.cmake exist ?
        testFilename = "CTestTestfile.cmake";
      } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
        // does the DartTestfile.txt exist ?
        testFilename = "DartTestfile.txt";
      } else {
        // No CTestTestfile? Who cares...
        continue;
      }
      fname += "/";
      fname += testFilename;
      readit = this->Makefile->ReadDependentFile(fname);
    }
    if (!readit) {
      std::string m = "Could not find include file: ";
      m += fname;
      this->SetError(m);
      return false;
    }
  }
  return true;
}